

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O3

int Msat_ClausePropagate(Msat_Clause_t *pC,Msat_Lit_t Lit,int *pAssigns,Msat_Lit_t *pLit_out)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = Lit ^ 1;
  uVar5 = pC[1].Num;
  uVar6 = *(uint *)&pC[1].field_0x4;
  if (uVar5 == uVar4) {
    pC[1].Num = uVar6;
    *(uint *)&pC[1].field_0x4 = uVar4;
    uVar5 = uVar6;
  }
  else if (uVar6 != uVar4) {
    __assert_fail("pC->pData[1] == LitF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatClause.c"
                  ,0x155,
                  "int Msat_ClausePropagate(Msat_Clause_t *, Msat_Lit_t, int *, Msat_Lit_t *)");
  }
  iVar2 = 1;
  if (pAssigns[(int)uVar5 >> 1] != uVar5) {
    iVar2 = 0;
    if ((0x10 < (*(uint *)&pC->field_0x4 & 0x1fff8)) &&
       (uVar6 = *(uint *)&pC->field_0x4 >> 3 & 0x3fff, 2 < uVar6)) {
      lVar3 = 0;
      do {
        uVar1 = (&pC[2].Num)[lVar3];
        if ((pAssigns[(int)uVar1 >> 1] ^ uVar1) != 1) {
          *(uint *)&pC[1].field_0x4 = uVar1;
          (&pC[2].Num)[lVar3] = uVar4;
          uVar5 = *(uint *)&pC[1].field_0x4 ^ 1;
          iVar2 = 1;
          goto LAB_00936e48;
        }
        lVar3 = lVar3 + 1;
      } while ((ulong)uVar6 - 2 != lVar3);
      iVar2 = 0;
    }
LAB_00936e48:
    *pLit_out = uVar5;
  }
  return iVar2;
}

Assistant:

int  Msat_ClausePropagate( Msat_Clause_t * pC, Msat_Lit_t Lit, int * pAssigns, Msat_Lit_t * pLit_out )
{
    // make sure the false literal is pC->pData[1]
    Msat_Lit_t LitF = MSAT_LITNOT(Lit);
    if ( pC->pData[0] == LitF )
         pC->pData[0] = pC->pData[1], pC->pData[1] = LitF;
    assert( pC->pData[1] == LitF );
    // if the 0-th watch is true, clause is already satisfied
    if ( pAssigns[MSAT_LIT2VAR(pC->pData[0])] == pC->pData[0] )
        return 1; 
    // look for a new watch
    if ( pC->nSize > 2 )
    {
        int i;
        for ( i = 2; i < (int)pC->nSize; i++ )
            if ( pAssigns[MSAT_LIT2VAR(pC->pData[i])] != MSAT_LITNOT(pC->pData[i]) )
            {
                pC->pData[1] = pC->pData[i], pC->pData[i] = LitF;
                *pLit_out = MSAT_LITNOT(pC->pData[1]);
                return 1; 
            }
    }
    // clause is unit under assignment
    *pLit_out = pC->pData[0];
    return 0;
}